

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTImage getRenderBuffer(void)

{
  IceTTimeStamp IVar1;
  IceTTimeStamp IVar2;
  IceTImage image;
  IceTVoid *buffer;
  IceTSizeType dummy_size;
  IceTVoid *buffer_1;
  
  IVar1 = icetStateGetTime(0x93);
  IVar2 = icetStateGetTime(0x80);
  if (IVar2 < IVar1) {
    icetGetPointerv(0x93,&buffer);
    image = icetImageUnpackageFromReceive((IceTVoid *)CONCAT44(buffer._4_4_,(IceTSizeType)buffer));
  }
  else {
    icetGetIntegerv(7,(IceTInt *)&buffer);
    icetGetIntegerv(8,(IceTInt *)((long)&buffer + 4));
    image = icetGetStateBufferImage(0x91,(IceTSizeType)buffer,buffer._4_4_);
    icetStateSetIntegerv(0x92,2,(IceTInt *)&buffer);
    icetImagePackageForSend(image,&buffer_1,&dummy_size);
    icetStateSetPointer(0x93,buffer_1);
  }
  return (IceTImage)image.opaque_internals;
}

Assistant:

static IceTImage getRenderBuffer(void)
{
    /* Check to see if we are in the same frame as the last time we returned
       this buffer.  In that case, just restore the buffer because it still has
       the image we need. */
    if (  icetStateGetTime(ICET_RENDER_BUFFER_HOLD)
        > icetStateGetTime(ICET_IS_DRAWING_FRAME) ) {
      /* A little bit of hackery: this assumes that a buffer initialized is the
         same one returned from icetImagePackageForSend.  It (currently)
         does. */
        IceTVoid *buffer;
        icetRaiseDebug("Last render should still be good.");
        icetGetPointerv(ICET_RENDER_BUFFER_HOLD, &buffer);
        return icetImageUnpackageFromReceive(buffer);       
    } else {
        IceTInt dim[2];
        IceTImage image;
        IceTVoid *buffer;
        IceTSizeType dummy_size;

        icetGetIntegerv(ICET_PHYSICAL_RENDER_WIDTH, &dim[0]);
        icetGetIntegerv(ICET_PHYSICAL_RENDER_HEIGHT, &dim[1]);

        /* Create a new image object. */
        image = icetGetStateBufferImage(ICET_RENDER_BUFFER, dim[0], dim[1]);

        /* Record image size and pointer to memory.  It is important to "touch"
           ICET_RENDER_BUFFER_HOLD to signify the time we created the image so
           that the above check works on the next call. */

        icetStateSetIntegerv(ICET_RENDER_BUFFER_SIZE, 2, dim);

        icetImagePackageForSend(image, &buffer, &dummy_size);
        icetStateSetPointer(ICET_RENDER_BUFFER_HOLD, buffer);

        return image;
    }
}